

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

int Gia_ManSuppSizeTest(Gia_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  Gia_Obj_t *pObj;
  abctime aVar3;
  abctime time;
  uint uVar4;
  int v;
  char *pStr;
  
  uVar4 = 0;
  aVar2 = Abc_Clock();
  v = 0;
  do {
    iVar1 = p->nObjs;
    if (iVar1 <= v) {
LAB_0054dce0:
      pStr = (char *)(ulong)uVar4;
      printf("Nodes with small support %d (out of %d)\n",pStr,
             (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + iVar1));
      aVar3 = Abc_Clock();
      Abc_PrintTime((int)aVar3 - (int)aVar2,pStr,time);
      return uVar4;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      iVar1 = p->nObjs;
      goto LAB_0054dce0;
    }
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar1 = Gia_ManSuppSizeOne(p,pObj);
      uVar4 = uVar4 + (iVar1 < 0x11);
    }
    v = v + 1;
  } while( true );
}

Assistant:

int Gia_ManSuppSizeTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            Counter += (Gia_ManSuppSizeOne(p, pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Gia_ManAndNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}